

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elempatch.c
# Opt level: O0

void fill_func3(int nelem,int type,void *buf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RDX;
  undefined4 in_ESI;
  int in_EDI;
  double dVar5;
  int i;
  int local_48;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  int local_28;
  int local_24;
  int local_14;
  
  switch(in_ESI) {
  case 0x3e9:
    for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
      iVar1 = ifun(local_14);
      if (iVar1 < 0) {
        local_48 = ifun(local_14);
        local_48 = -local_48;
      }
      else {
        local_48 = ifun(local_14);
      }
      *(int *)(in_RDX + (long)local_14 * 4) = local_48;
    }
    break;
  case 0x3ea:
    for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
      iVar1 = ifun(local_14);
      if (iVar1 < 0) {
        local_28 = ifun(local_14);
        local_28 = -local_28;
      }
      else {
        local_28 = ifun(local_14);
      }
      *(long *)(in_RDX + (long)local_14 * 8) = (long)local_28;
    }
    break;
  case 0x3eb:
    for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
      iVar1 = ifun(local_14);
      if (iVar1 < 0) {
        local_24 = ifun(local_14);
        local_24 = -local_24;
      }
      else {
        local_24 = ifun(local_14);
      }
      *(float *)(in_RDX + (long)local_14 * 4) = (float)local_24;
    }
    break;
  case 0x3ec:
    for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
      iVar1 = ifun(local_14);
      if (iVar1 < 0) {
        local_2c = ifun(local_14);
        local_2c = -local_2c;
      }
      else {
        local_2c = ifun(local_14);
      }
      *(double *)(in_RDX + (long)local_14 * 8) = (double)local_2c;
    }
    break;
  default:
    GA_Error((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
    break;
  case 0x3ee:
    for (local_14 = 0; local_14 < in_EDI * 2 + -1; local_14 = local_14 + 2) {
      iVar2 = ifun(local_14);
      iVar1 = ifun(local_14);
      iVar2 = iVar2 * iVar1;
      iVar1 = ifun(local_14 + 1);
      iVar3 = ifun(local_14 + 1);
      dVar5 = sqrt((double)(iVar2 + iVar1 * iVar3));
      *(float *)(in_RDX + (long)local_14 * 4) = (float)dVar5;
      *(undefined4 *)(in_RDX + (long)(local_14 + 1) * 4) = 0;
    }
    break;
  case 0x3ef:
    for (local_14 = 0; local_14 < in_EDI * 2 + -1; local_14 = local_14 + 2) {
      iVar1 = ifun(local_14);
      iVar2 = ifun(local_14);
      iVar3 = ifun(local_14 + 1);
      iVar4 = ifun(local_14 + 1);
      dVar5 = sqrt((double)(iVar1 * iVar2 + iVar3 * iVar4));
      *(double *)(in_RDX + (long)local_14 * 8) = dVar5;
      *(undefined8 *)(in_RDX + (long)(local_14 + 1) * 8) = 0;
    }
  }
  return;
}

Assistant:

void
fill_func3 (int nelem, int type, void *buf)
  /*taking the absolute of the ifun() */
{
  /*int i,size=MA_sizeof(MT_CHAR,type,1);*/

  int i;

  switch (type)
  {
    case C_FLOAT:
      for (i = 0; i < nelem; i++)
        ((float *) buf)[i] = (float) GA_ABS (ifun (i));
      break;
    case C_LONG:
      for (i = 0; i < nelem; i++)
        ((long *) buf)[i] = (long) GA_ABS (ifun (i));
      break;
    case C_DBL:
      for (i = 0; i < nelem; i++)
        ((double *) buf)[i] = (double) GA_ABS (ifun (i));
      break;
    case C_DCPL:
      for (i = 0; i < 2 * nelem - 1; i = i + 2)
      {
        ((double *) buf)[i] =
          sqrt ((double)
              (ifun (i) * ifun (i) + ifun (i + 1) * ifun (i + 1)));
        ((double *) buf)[i + 1] = 0.0;
      }
      break;
    case C_SCPL:
      for (i = 0; i < 2 * nelem - 1; i = i + 2)
      {
        ((float *) buf)[i] =
          sqrt ((float)
              (ifun (i) * ifun (i) + ifun (i + 1) * ifun (i + 1)));
        ((float *) buf)[i + 1] = 0.0;
      }
      break;
    case C_INT:
      for (i = 0; i < nelem; i++)
        ((int *) buf)[i] = GA_ABS (ifun (i));
      break;
    default:
      GA_Error (" wrong data type ", type);

  }
}